

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O0

bool Diligent::ShaderSerializer<(Diligent::SerializerMode)2>::SerializeCI
               (Serializer<(Diligent::SerializerMode)2> *Ser,ConstQual<ShaderCreateInfo> *CI)

{
  bool bVar1;
  ConstQual<ShaderCreateInfo> *CI_local;
  Serializer<(Diligent::SerializerMode)2> *Ser_local;
  
  bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()
                    (Ser,(char **)&CI->Desc,&(CI->Desc).ShaderType,
                     &(CI->Desc).UseCombinedTextureSamplers,&(CI->Desc).CombinedSamplerSuffix,
                     &CI->EntryPoint,&CI->SourceLanguage,&CI->ShaderCompiler,&CI->HLSLVersion,
                     &CI->GLSLVersion,&CI->GLESSLVersion,&CI->MSLVersion,&CI->CompileFlags,
                     &CI->LoadConstantBufferReflection,&CI->GLSLExtensions,
                     &CI->WebGPUEmulatedArrayIndexSuffix);
  if (bVar1) {
    Ser_local._7_1_ = SerializeBytecodeOrSource(Ser,CI);
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

bool ShaderSerializer<Mode>::SerializeCI(Serializer<Mode>&            Ser,
                                         ConstQual<ShaderCreateInfo>& CI)
{
    if (!Ser(CI.Desc.Name,
             CI.Desc.ShaderType,
             CI.Desc.UseCombinedTextureSamplers,
             CI.Desc.CombinedSamplerSuffix,
             CI.EntryPoint,
             CI.SourceLanguage,
             CI.ShaderCompiler,
             CI.HLSLVersion,
             CI.GLSLVersion,
             CI.GLESSLVersion,
             CI.MSLVersion,
             CI.CompileFlags,
             CI.LoadConstantBufferReflection,
             CI.GLSLExtensions,
             CI.WebGPUEmulatedArrayIndexSuffix))
        return false;

    return SerializeBytecodeOrSource(Ser, CI);

    ASSERT_SIZEOF64(ShaderCreateInfo, 152, "Did you add a new member to ShaderCreateInfo? Please add serialization here.");
}